

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall
ncnn::Net::forward_layer
          (Net *this,int layer_index,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *blob_mats,
          Option *opt)

{
  ulong uVar1;
  int iVar2;
  const_reference ppLVar3;
  const_reference pvVar4;
  reference pvVar5;
  size_type sVar6;
  Mat *pMVar7;
  int iVar8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  int in_ESI;
  long in_RDI;
  void *in_R8;
  bool bVar9;
  int top_blob_index_2;
  size_t i_2;
  int ret_5;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> top_blobs;
  int top_blob_index_1;
  size_t i_1;
  int ret_4;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs;
  Mat bottom_blob_packed_1;
  int elempack_1;
  int ret_3;
  int bottom_blob_index_1;
  size_t i;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs;
  int ret_2;
  Mat top_blob;
  int ret_1;
  Mat *bottom_top_blob;
  Mat bottom_blob_packed;
  int elempack;
  Mat bottom_blob;
  int ret;
  int top_blob_index;
  int bottom_blob_index;
  Layer *layer;
  Option *in_stack_00000618;
  int in_stack_00000624;
  Mat *in_stack_00000628;
  Mat *in_stack_00000630;
  Mat *in_stack_fffffffffffffd00;
  Mat *in_stack_fffffffffffffd08;
  Mat *this_00;
  undefined4 in_stack_fffffffffffffd10;
  int in_stack_fffffffffffffd14;
  size_type in_stack_fffffffffffffd18;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffffd20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *this_01;
  Mat *local_270;
  undefined1 local_261 [29];
  int local_244;
  ulong local_240;
  int local_234;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_230;
  Mat local_228;
  int local_1e4;
  Mat local_1e0;
  int local_1a0;
  int local_19c;
  ulong local_198;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_188;
  int local_16c;
  Mat local_168;
  uint local_128;
  int local_124;
  Mat *local_120;
  Mat local_118;
  int local_d4;
  Mat local_d0;
  Mat local_80;
  undefined4 local_3c;
  value_type local_38;
  int local_34;
  value_type opt_00;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *blob_mats_00;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  blob_mats_00 = in_RCX;
  ppLVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                       (long)in_ESI);
  iVar8 = (int)in_RCX;
  opt_00 = *ppLVar3;
  if ((opt_00->one_blob_only & 1U) == 0) {
    std::vector<int,_std::allocator<int>_>::size(&opt_00->bottoms);
    std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x118114);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x11813a);
    for (local_198 = 0; uVar1 = local_198,
        sVar6 = std::vector<int,_std::allocator<int>_>::size(&opt_00->bottoms), uVar1 < sVar6;
        local_198 = local_198 + 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&opt_00->bottoms,local_198);
      iVar8 = (int)sVar6;
      local_19c = *pvVar4;
      pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                         (in_RDX,(long)local_19c);
      if (pvVar5->dims == 0) {
        std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                  ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(in_RDI + 0x28),
                   (long)local_19c);
        iVar8 = (int)blob_mats_00;
        local_1a0 = forward_layer((Net *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                  (int)((ulong)in_RDX >> 0x20),blob_mats_00,(Option *)opt_00);
        if (local_1a0 != 0) {
          local_128 = 1;
          local_4 = local_1a0;
          goto LAB_001187a2;
        }
      }
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,(long)local_19c);
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_188,local_198);
      Mat::operator=(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      if (((ulong)(blob_mats_00->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start & 1) != 0) {
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,(long)local_19c);
        Mat::release(in_stack_fffffffffffffd00);
        if (((opt_00->support_inplace & 1U) != 0) &&
           (pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                               (&local_188,local_198), *pvVar5->refcount != 1)) {
          pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                             (&local_188,local_198);
          Mat::clone(&local_1e0,(__fn *)pvVar5,(void *)0x0,iVar8,in_R8);
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_188,local_198);
          Mat::operator=(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
          Mat::~Mat((Mat *)0x11836a);
        }
      }
      if (((ulong)blob_mats_00[1].super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_finish & 0x100) != 0) {
        local_1e4 = (opt_00->support_packing & 1) * 3 + 1;
        Mat::Mat(&local_228);
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_188,local_198);
        convert_packing(in_stack_00000630,in_stack_00000628,in_stack_00000624,in_stack_00000618);
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_188,local_198);
        Mat::operator=(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
        Mat::~Mat((Mat *)0x11843b);
      }
    }
    if ((((ulong)(blob_mats_00->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start & 1) == 0) ||
       ((opt_00->support_inplace & 1U) == 0)) {
      sVar6 = std::vector<int,_std::allocator<int>_>::size(&opt_00->tops);
      this_01 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)local_261;
      std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x1185ea);
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                (this_01,sVar6,
                 (allocator_type *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
      std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x118610);
      in_stack_fffffffffffffd14 =
           (*opt_00->_vptr_Layer[6])(opt_00,&local_188,local_261 + 1,blob_mats_00);
      if (in_stack_fffffffffffffd14 == 0) {
        local_270 = (Mat *)0x0;
        while (this_00 = local_270,
              pMVar7 = (Mat *)std::vector<int,_std::allocator<int>_>::size(&opt_00->tops),
              this_00 < pMVar7) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&opt_00->tops,(size_type)local_270);
          iVar8 = *pvVar4;
          pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                             ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(local_261 + 1),
                              (size_type)local_270);
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,(long)iVar8);
          Mat::operator=(this_00,pvVar5);
          local_270 = (Mat *)((long)&local_270->data + 1);
        }
        local_128 = 0;
      }
      else {
        local_128 = 1;
        local_4 = in_stack_fffffffffffffd14;
      }
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                 CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
      if (local_128 == 0) goto LAB_00118797;
    }
    else {
      local_230 = &local_188;
      local_234 = (*opt_00->_vptr_Layer[8])(opt_00,local_230,blob_mats_00);
      if (local_234 == 0) {
        for (local_240 = 0; uVar1 = local_240,
            sVar6 = std::vector<int,_std::allocator<int>_>::size(&opt_00->tops), uVar1 < sVar6;
            local_240 = local_240 + 1) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&opt_00->tops,local_240);
          local_244 = *pvVar4;
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_230,local_240);
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,(long)local_244);
          Mat::operator=(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
        }
LAB_00118797:
        local_128 = 0;
      }
      else {
        local_128 = 1;
        local_4 = local_234;
      }
    }
LAB_001187a2:
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
               CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    goto joined_r0x001187b8;
  }
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&opt_00->bottoms,0);
  local_34 = *pvVar4;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&opt_00->tops,0);
  local_38 = *pvVar4;
  pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,(long)local_34);
  if (pvVar5->dims == 0) {
    std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
              ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(in_RDI + 0x28),(long)local_34);
    iVar8 = (int)blob_mats_00;
    iVar2 = forward_layer((Net *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                          (int)((ulong)in_RDX >> 0x20),blob_mats_00,(Option *)opt_00);
    if (iVar2 != 0) {
      return iVar2;
    }
    local_3c = 0;
  }
  pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,(long)local_34);
  Mat::Mat(&local_80,pvVar5);
  if (((ulong)(blob_mats_00->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start & 1) != 0) {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,(long)local_34);
    Mat::release(in_stack_fffffffffffffd00);
    if (((opt_00->support_inplace & 1U) != 0) && (*local_80.refcount != 1)) {
      Mat::clone(&local_d0,(__fn *)&local_80,(void *)0x0,iVar8,in_R8);
      Mat::operator=(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      Mat::~Mat((Mat *)0x117e11);
    }
  }
  if (((ulong)blob_mats_00[1].super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish & 0x100) != 0) {
    local_d4 = (opt_00->support_packing & 1) * 3 + 1;
    Mat::Mat(&local_118);
    convert_packing(in_stack_00000630,in_stack_00000628,in_stack_00000624,in_stack_00000618);
    Mat::operator=(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
    Mat::~Mat((Mat *)0x117edb);
  }
  if ((((ulong)(blob_mats_00->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start & 1) == 0) || ((opt_00->support_inplace & 1U) == 0))
  {
    Mat::Mat(&local_168);
    local_16c = (*opt_00->_vptr_Layer[7])(opt_00,&local_80,&local_168,blob_mats_00);
    bVar9 = local_16c == 0;
    iVar8 = local_16c;
    if (bVar9) {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,(long)local_38);
      Mat::operator=(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      iVar8 = local_4;
    }
    local_4 = iVar8;
    local_128 = (uint)!bVar9;
    Mat::~Mat((Mat *)0x11809c);
    if (local_128 == 0) goto LAB_001180ab;
  }
  else {
    local_120 = &local_80;
    local_124 = (*opt_00->_vptr_Layer[9])(opt_00,local_120,blob_mats_00);
    if (local_124 == 0) {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,(long)local_38);
      Mat::operator=(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
LAB_001180ab:
      local_128 = 0;
    }
    else {
      local_128 = 1;
      local_4 = local_124;
    }
  }
  Mat::~Mat((Mat *)0x1180c3);
joined_r0x001187b8:
  if (local_128 == 0) {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Net::forward_layer(int layer_index, std::vector<Mat>& blob_mats, Option& opt) const
{
    const Layer* layer = layers[layer_index];

//     fprintf(stderr, "forward_layer %d %s\n", layer_index, layer->name.c_str());

    if (layer->one_blob_only)
    {
        // load bottom blob
        int bottom_blob_index = layer->bottoms[0];
        int top_blob_index = layer->tops[0];

        if (blob_mats[bottom_blob_index].dims == 0)
        {
            int ret = forward_layer(blobs[bottom_blob_index].producer, blob_mats, opt);
            if (ret != 0)
                return ret;
        }

        Mat bottom_blob = blob_mats[bottom_blob_index];

        if (opt.lightmode)
        {
            // delete after taken in light mode
            blob_mats[bottom_blob_index].release();
            // deep copy for inplace forward if data is shared
            if (layer->support_inplace && *bottom_blob.refcount != 1)
            {
                bottom_blob = bottom_blob.clone();
            }
        }

        if (opt.use_packing_layout)
        {
            int elempack = layer->support_packing ? 4 : 1;

            Mat bottom_blob_packed;
            convert_packing(bottom_blob, bottom_blob_packed, elempack, opt);
            bottom_blob = bottom_blob_packed;
        }

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            Mat& bottom_top_blob = bottom_blob;
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward_inplace(bottom_top_blob, opt);
            double end = get_current_time();
            benchmark(layer, bottom_top_blob, bottom_top_blob, start, end);
#else
            int ret = layer->forward_inplace(bottom_top_blob, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = bottom_top_blob;
        }
        else
        {
            Mat top_blob;
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward(bottom_blob, top_blob, opt);
            double end = get_current_time();
            benchmark(layer, bottom_blob, top_blob, start, end);
#else
            int ret = layer->forward(bottom_blob, top_blob, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = top_blob;
        }

    }
    else
    {
        // load bottom blobs
        std::vector<Mat> bottom_blobs(layer->bottoms.size());
        for (size_t i=0; i<layer->bottoms.size(); i++)
        {
            int bottom_blob_index = layer->bottoms[i];

            if (blob_mats[bottom_blob_index].dims == 0)
            {
                int ret = forward_layer(blobs[bottom_blob_index].producer, blob_mats, opt);
                if (ret != 0)
                    return ret;
            }

            bottom_blobs[i] = blob_mats[bottom_blob_index];

            if (opt.lightmode)
            {
                // delete after taken in light mode
                blob_mats[bottom_blob_index].release();
                // deep copy for inplace forward if data is shared
                if (layer->support_inplace && *bottom_blobs[i].refcount != 1)
                {
                    bottom_blobs[i] = bottom_blobs[i].clone();
                }
            }

            if (opt.use_packing_layout)
            {
                int elempack = layer->support_packing ? 4 : 1;

                Mat bottom_blob_packed;
                convert_packing(bottom_blobs[i], bottom_blob_packed, elempack, opt);
                bottom_blobs[i] = bottom_blob_packed;
            }
        }

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            std::vector<Mat>& bottom_top_blobs = bottom_blobs;
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward_inplace(bottom_top_blobs, opt);
            double end = get_current_time();
            benchmark(layer, start, end);
#else
            int ret = layer->forward_inplace(bottom_top_blobs, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i=0; i<layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = bottom_top_blobs[i];
            }
        }
        else
        {
            std::vector<Mat> top_blobs(layer->tops.size());
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward(bottom_blobs, top_blobs, opt);
            double end = get_current_time();
            benchmark(layer, start, end);
#else
            int ret = layer->forward(bottom_blobs, top_blobs, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i=0; i<layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = top_blobs[i];
            }
        }
    }

//     fprintf(stderr, "forward_layer %d %s done\n", layer_index, layer->name.c_str());
//     const Mat& blob = blob_mats[layer->tops[0]];
//     fprintf(stderr, "[%-2d %-16s %-16s]  %d    blobs count = %-3d   size = %-3d x %-3d\n", layer_index, layer->type.c_str(), layer->name.c_str(), layer->tops[0], blob.c, blob.h, blob.w);

    return 0;
}